

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  CameraSample sample;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  int i;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  uint uVar49;
  float fVar50;
  float fVar51;
  Vector3f VVar52;
  Vector3f v;
  optional<pbrt::CameraRayDifferential> crd;
  SampledWavelengths lambda;
  undefined1 local_120 [112];
  bool local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vector3f *local_88;
  Vector3f *local_80;
  Vector3f *local_78;
  Vector3f *local_70;
  float local_68;
  float fStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  SampledWavelengths local_50;
  undefined1 auVar27 [16];
  undefined1 auVar30 [56];
  
  local_80 = &this->minDirDifferentialY;
  auVar24._8_4_ = 0x7f800000;
  auVar24._0_8_ = 0x7f8000007f800000;
  auVar24._12_4_ = 0x7f800000;
  uVar5 = vmovlps_avx(auVar24);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar5 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  local_88 = &this->minDirDifferentialX;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar10 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar11 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar10;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar11;
  local_70 = &this->minPosDifferentialY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar10;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar11;
  local_78 = &this->minPosDifferentialX;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar10;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar11;
  SampledWavelengths::SampleXYZ(&local_50,0.5);
  iVar18 = 0;
  do {
    uVar5 = *(undefined8 *)
             ((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
             0xffffffffffff);
    local_68 = ((float)iVar18 / 511.0) * (float)(int)uVar5;
    fStack_64 = ((float)iVar18 / 511.0) * (float)(int)((ulong)uVar5 >> 0x20);
    uStack_60 = 0x3f0000003f000000;
    local_58 = 0x3f8000003f000000;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fStack_64;
    sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x = local_68;
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
    sample.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
    sample.time = 0.5;
    sample.weight = 1.0;
    CameraHandle::GenerateRayDifferential
              ((optional<pbrt::CameraRayDifferential> *)local_120,camera,sample,&local_50);
    uVar17 = local_120._24_4_;
    uVar16 = local_120._8_4_;
    if (local_b0 == true) {
      uVar14 = local_120._0_4_;
      uVar15 = local_120._4_4_;
      auVar24 = vinsertps_avx(ZEXT416((uint)((float)local_120._44_4_ - (float)local_120._0_4_)),
                              ZEXT416((uint)((float)local_120._48_4_ - (float)local_120._4_4_)),0x10
                             );
      VVar52.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar24._0_8_;
      VVar52.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_120._52_4_ - (float)local_120._8_4_
      ;
      auVar30 = ZEXT856(auVar24._8_8_);
      VVar52 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,VVar52,(Float)local_120._24_4_);
      fVar51 = VVar52.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar28._0_8_ = VVar52.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar28._8_56_ = auVar30;
      auVar25._0_4_ =
           VVar52.super_Tuple3<pbrt::Vector3,_float>.x * VVar52.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar25._4_4_ =
           VVar52.super_Tuple3<pbrt::Vector3,_float>.y * VVar52.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar25._8_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar25._12_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar24 = vhaddps_avx(auVar25,auVar25);
      fVar21 = fVar51 * fVar51 + auVar24._0_4_;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar24._0_4_;
      }
      fVar50 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar1 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar6 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar27._0_4_ = (float)uVar1 * (float)uVar1;
      auVar27._4_4_ = (float)uVar6 * (float)uVar6;
      auVar27._8_8_ = 0;
      auVar24 = vmovshdup_avx(auVar27);
      fVar50 = fVar50 * fVar50 + auVar27._0_4_ + auVar24._0_4_;
      if (fVar50 < 0.0) {
        fVar50 = sqrtf(fVar50);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
        fVar50 = auVar24._0_4_;
      }
      if (fVar21 < fVar50) {
        uVar5 = vmovlps_avx(auVar28._0_16_);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar51;
      }
      auVar24 = vinsertps_avx(ZEXT416((uint)((float)local_120._56_4_ - (float)uVar14)),
                              ZEXT416((uint)((float)local_120._60_4_ - (float)uVar15)),0x10);
      v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar24._0_8_;
      v.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_120._64_4_ - (float)uVar16;
      auVar30 = ZEXT856(auVar24._8_8_);
      VVar52 = AnimatedTransform::ApplyInverse((AnimatedTransform *)this,v,(Float)uVar17);
      fVar51 = VVar52.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_8_ = VVar52.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar30;
      auVar26._0_4_ =
           VVar52.super_Tuple3<pbrt::Vector3,_float>.x * VVar52.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar26._4_4_ =
           VVar52.super_Tuple3<pbrt::Vector3,_float>.y * VVar52.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar26._8_4_ = auVar30._0_4_ * auVar30._0_4_;
      auVar26._12_4_ = auVar30._4_4_ * auVar30._4_4_;
      auVar24 = vhaddps_avx(auVar26,auVar26);
      fVar21 = fVar51 * fVar51 + auVar24._0_4_;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar24._0_4_;
      }
      fVar50 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar2 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar7 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_4_ = (float)uVar2 * (float)uVar2;
      auVar19._4_4_ = (float)uVar7 * (float)uVar7;
      auVar19._8_8_ = 0;
      auVar24 = vmovshdup_avx(auVar19);
      fVar50 = fVar50 * fVar50 + auVar19._0_4_ + auVar24._0_4_;
      if (fVar50 < 0.0) {
        fVar50 = sqrtf(fVar50);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
        fVar50 = auVar24._0_4_;
      }
      uVar16 = local_120._20_4_;
      if (fVar21 < fVar50) {
        uVar5 = vmovlps_avx(auVar29._0_16_);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar51;
      }
      auVar20._4_4_ = local_120._16_4_;
      auVar20._0_4_ = local_120._12_4_;
      auVar20._8_8_ = 0;
      auVar32._0_4_ = (float)local_120._12_4_ * (float)local_120._12_4_;
      auVar32._4_4_ = (float)local_120._16_4_ * (float)local_120._16_4_;
      auVar32._8_8_ = 0;
      auVar24 = vhaddps_avx(auVar32,auVar32);
      fVar21 = auVar24._0_4_ + (float)local_120._20_4_ * (float)local_120._20_4_;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar24._0_4_;
      }
      uVar17 = local_120._76_4_;
      auVar33._4_4_ = fVar21;
      auVar33._0_4_ = fVar21;
      auVar33._8_4_ = fVar21;
      auVar33._12_4_ = fVar21;
      auVar24 = vdivps_avx(auVar20,auVar33);
      fVar21 = (float)uVar16 / fVar21;
      auVar27 = ZEXT416((uint)fVar21);
      uVar5 = vmovlps_avx(auVar24);
      local_120._12_4_ = (undefined4)uVar5;
      local_120._16_4_ = (undefined4)((ulong)uVar5 >> 0x20);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_120._68_8_;
      auVar34._0_4_ = (float)local_120._68_8_ * (float)local_120._68_8_;
      auVar34._4_4_ = SUB84(local_120._68_8_,4) * SUB84(local_120._68_8_,4);
      auVar34._8_8_ = 0;
      auVar25 = vhaddps_avx(auVar34,auVar34);
      fVar51 = auVar25._0_4_ + (float)local_120._76_4_ * (float)local_120._76_4_;
      local_120._20_4_ = fVar21;
      if (fVar51 < 0.0) {
        fVar51 = sqrtf(fVar51);
      }
      else {
        auVar25 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
        fVar51 = auVar25._0_4_;
      }
      uVar16 = local_120._88_4_;
      auVar35._4_4_ = fVar51;
      auVar35._0_4_ = fVar51;
      auVar35._8_4_ = fVar51;
      auVar35._12_4_ = fVar51;
      auVar25 = vdivps_avx(auVar44,auVar35);
      fVar51 = (float)uVar17 / fVar51;
      local_120._68_8_ = vmovlps_avx(auVar25);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_120._80_8_;
      auVar36._0_4_ = (float)local_120._80_8_ * (float)local_120._80_8_;
      auVar36._4_4_ = SUB84(local_120._80_8_,4) * SUB84(local_120._80_8_,4);
      auVar36._8_8_ = 0;
      auVar26 = vhaddps_avx(auVar36,auVar36);
      fVar50 = auVar26._0_4_ + (float)local_120._88_4_ * (float)local_120._88_4_;
      local_120._76_4_ = fVar51;
      if (fVar50 < 0.0) {
        fVar50 = sqrtf(fVar50);
      }
      else {
        auVar26 = vsqrtss_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
        fVar50 = auVar26._0_4_;
      }
      auVar37._4_4_ = fVar50;
      auVar37._0_4_ = fVar50;
      auVar37._8_4_ = fVar50;
      auVar37._12_4_ = fVar50;
      auVar26 = vdivps_avx(auVar45,auVar37);
      fVar50 = (float)uVar16 / fVar50;
      local_120._80_8_ = vmovlps_avx(auVar26);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar46._8_4_ = 0x80000000;
      auVar46._0_8_ = 0x8000000080000000;
      auVar46._12_4_ = 0x80000000;
      auVar19 = vpternlogd_avx512vl(auVar41,auVar27,auVar46,0xf8);
      fVar47 = auVar19._0_4_;
      fVar22 = -1.0 / (fVar47 + fVar21);
      local_a8 = vmovshdup_avx(auVar24);
      fVar43 = auVar24._0_4_;
      fVar48 = local_a8._0_4_;
      fVar12 = fVar48 * fVar43 * fVar22;
      auVar32 = vfmadd213ss_fma(ZEXT416((uint)(fVar43 * fVar47 * fVar43)),ZEXT416((uint)fVar22),
                                auVar41);
      fVar23 = fVar47 * fVar12;
      fVar47 = fVar43 * -fVar47;
      local_98 = vfmadd231ss_fma(auVar19,ZEXT416((uint)(fVar48 * fVar48)),ZEXT416((uint)fVar22));
      auVar19 = vmovshdup_avx(auVar25);
      fVar22 = auVar19._0_4_;
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar22)),auVar25,auVar32);
      auVar33 = ZEXT416((uint)fVar51);
      auVar19 = vfmadd231ss_fma(auVar19,auVar33,ZEXT416((uint)fVar47));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ * fVar22)),auVar25,
                                ZEXT416((uint)fVar12));
      auVar20 = vfnmadd231ss_fma(auVar20,auVar33,local_a8);
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * fVar22)),auVar24,auVar25);
      auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar33);
      fVar22 = auVar19._0_4_;
      fVar40 = auVar20._0_4_;
      fVar42 = auVar25._0_4_;
      fVar51 = fVar42 * fVar42 + fVar22 * fVar22 + fVar40 * fVar40;
      uVar49 = auVar32._0_4_;
      local_120._88_4_ = fVar50;
      if (fVar51 < 0.0) {
        fVar51 = sqrtf(fVar51);
        auVar32 = ZEXT416(uVar49);
      }
      else {
        auVar25 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
        fVar51 = auVar25._0_4_;
      }
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(local_a8,auVar13);
      auVar25 = vmovshdup_avx(auVar26);
      fVar31 = auVar25._0_4_;
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar31)),auVar26,auVar32);
      auVar33 = ZEXT416((uint)fVar50);
      auVar25 = vfmadd231ss_fma(auVar25,auVar33,ZEXT416((uint)fVar47));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ * fVar31)),auVar26,
                                ZEXT416((uint)fVar12));
      auVar19 = vfmadd231ss_fma(auVar19,auVar33,auVar20);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(local_a8._0_4_ * fVar31)),auVar26,
                                ZEXT416((uint)fVar43));
      auVar26 = vfmadd231ss_fma(auVar26,auVar33,ZEXT416((uint)fVar21));
      fVar50 = auVar25._0_4_;
      fVar43 = auVar19._0_4_;
      fVar31 = auVar26._0_4_;
      fVar21 = fVar31 * fVar31 + fVar50 * fVar50 + fVar43 * fVar43;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
        auVar32 = ZEXT416(uVar49);
      }
      else {
        auVar25 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar25._0_4_;
      }
      auVar25 = vfmadd213ss_fma(auVar32,auVar24,ZEXT416((uint)(local_a8._0_4_ * fVar23)));
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar47),auVar27,auVar25);
      auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar12),auVar24,
                                ZEXT416((uint)(local_a8._0_4_ * local_98._0_4_)));
      auVar26 = vfnmadd231ss_fma(auVar26,auVar27,local_a8);
      auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar48 * fVar48)),auVar24,auVar24);
      auVar24 = vfmadd231ss_fma(auVar24,auVar27,auVar27);
      fVar12 = fVar22 / fVar51 - auVar25._0_4_;
      fVar23 = fVar40 / fVar51 - auVar26._0_4_;
      fVar47 = fVar42 / fVar51 - auVar24._0_4_;
      local_98 = ZEXT416((uint)fVar23);
      fVar51 = fVar47 * fVar47 + fVar12 * fVar12 + fVar23 * fVar23;
      if (fVar51 < 0.0) {
        fVar51 = sqrtf(fVar51);
      }
      else {
        auVar27 = vsqrtss_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar51));
        fVar51 = auVar27._0_4_;
      }
      fVar23 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar3 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar8 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar38._0_4_ = (float)uVar3 * (float)uVar3;
      auVar38._4_4_ = (float)uVar8 * (float)uVar8;
      auVar38._8_8_ = 0;
      auVar27 = vmovshdup_avx(auVar38);
      fVar23 = fVar23 * fVar23 + auVar38._0_4_ + auVar27._0_4_;
      if (fVar23 < 0.0) {
        local_a8._0_4_ = fVar51;
        fVar23 = sqrtf(fVar23);
        fVar51 = (float)local_a8._0_4_;
      }
      else {
        auVar27 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
        fVar23 = auVar27._0_4_;
      }
      if (fVar51 < fVar23) {
        auVar27 = vinsertps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)local_98._0_4_),0x10);
        uVar5 = vmovlps_avx(auVar27);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar47;
      }
      fVar51 = fVar50 / fVar21 - auVar25._0_4_;
      fVar50 = fVar43 / fVar21 - auVar26._0_4_;
      fVar12 = fVar31 / fVar21 - auVar24._0_4_;
      fVar21 = fVar12 * fVar12 + fVar51 * fVar51 + fVar50 * fVar50;
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar24._0_4_;
      }
      fVar23 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar4 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      uVar9 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar39._0_4_ = (float)uVar4 * (float)uVar4;
      auVar39._4_4_ = (float)uVar9 * (float)uVar9;
      auVar39._8_8_ = 0;
      auVar24 = vmovshdup_avx(auVar39);
      fVar23 = fVar23 * fVar23 + auVar39._0_4_ + auVar24._0_4_;
      if (fVar23 < 0.0) {
        fVar23 = sqrtf(fVar23);
      }
      else {
        auVar24 = vsqrtss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
        fVar23 = auVar24._0_4_;
      }
      if (fVar21 < fVar23) {
        auVar24 = vinsertps_avx(ZEXT416((uint)fVar51),ZEXT416((uint)fVar50),0x10);
        uVar5 = vmovlps_avx(auVar24);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar5;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar5 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar12;
      }
      local_b0 = false;
    }
    iVar18 = iVar18 + 1;
  } while (iVar18 != 0x200);
  if (LOGGING_LogLevel < 1) {
    local_120._8_4_ = 0;
    local_120._12_4_ = 0;
    local_120._16_4_ = local_120._16_4_ & 0xffffff00;
    local_120._0_8_ = (long)local_120 + 0x10;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_120,"Camera min pos differentials: %s, %s",local_78,local_70);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
        ,0xe7,(char *)local_120._0_8_);
    if (local_120._0_8_ != (long)local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,CONCAT44(local_120._20_4_,local_120._16_4_) + 1);
    }
  }
  if (LOGGING_LogLevel < 1) {
    local_120._8_4_ = 0;
    local_120._12_4_ = 0;
    local_120._16_4_ = local_120._16_4_ & 0xffffff00;
    local_120._0_8_ = (long)local_120 + 0x10;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_120,"Camera min dir differentials: %s, %s",local_88,local_80);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cameras.cpp"
        ,0xe9,(char *)local_120._0_8_);
    if (local_120._0_8_ != (long)local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,CONCAT44(local_120._20_4_,local_120._16_4_) + 1);
    }
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}